

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O3

void __thiscall ExecutionEngine::i_ldc_w(ExecutionEngine *this)

{
  uchar uVar1;
  ushort uVar2;
  uint uVar3;
  cp_info *pcVar4;
  double dVar5;
  long lVar6;
  uint uVar7;
  _Alloc_hider _Var8;
  uint uVar9;
  VMStack *this_00;
  Frame *this_01;
  u1 *puVar10;
  cp_info **ppcVar11;
  StringObject *this_02;
  size_t sVar12;
  ostream *poVar13;
  ulong uVar14;
  ulong uVar15;
  undefined8 uVar16;
  uint uVar17;
  char *__s;
  Value operand;
  undefined1 *puStack_60;
  string local_58;
  double local_38;
  
  puStack_60 = (undefined1 *)0x116eb2;
  this_00 = VMStack::getInstance();
  puStack_60 = (undefined1 *)0x116eba;
  this_01 = VMStack::getTopFrame(this_00);
  puStack_60 = (undefined1 *)0x116ec7;
  puVar10 = Frame::getCode(this_01,this_01->pc);
  uVar15 = (ulong)(ushort)(*(ushort *)(puVar10 + 1) << 8 | *(ushort *)(puVar10 + 1) >> 8);
  puStack_60 = (undefined1 *)0x116edb;
  ppcVar11 = Frame::getConstantPool(this_01);
  pcVar4 = *ppcVar11;
  uVar1 = pcVar4[uVar15 - 1].tag;
  uVar3 = pcVar4[uVar15 - 1].info.long_info.high_bytes;
  this_02 = (StringObject *)(ulong)uVar3;
  if (uVar1 == '\x03') {
    uVar15 = 0;
    uVar16 = 0x400000004;
  }
  else if (uVar1 == '\x04') {
    uVar17 = uVar3 >> 0x17 & 0xff;
    uVar7 = uVar3 & 0x7fffff | 0x800000;
    if (uVar17 == 0) {
      uVar7 = uVar3 * 2 & 0xfffffe;
    }
    uVar9 = -uVar7;
    if (-1 < (int)uVar3) {
      uVar9 = uVar7;
    }
    local_38 = (double)(int)uVar9;
    puStack_60 = (undefined1 *)0x116fa1;
    dVar5 = ldexp(1.0,uVar17 - 0x96);
    this_02 = (StringObject *)(ulong)(uint)(float)(dVar5 * local_38);
    uVar16 = 0x500000000;
    uVar15 = 0;
  }
  else {
    if (uVar1 != '\b') {
      puStack_60 = (undefined1 *)0x117069;
      poVar13 = std::operator<<((ostream *)&std::cerr,
                                "ldc_w tentando acessar um elemento da CP invalido: ");
      puStack_60 = (undefined1 *)0x117075;
      poVar13 = std::operator<<(poVar13,uVar1);
      puStack_60 = (undefined1 *)0x11707d;
      std::endl<char,std::char_traits<char>>(poVar13);
      puStack_60 = (undefined1 *)0x117087;
      exit(1);
    }
    uVar15 = (ulong)this_02 & 0xffff;
    if (pcVar4[uVar15 - 1].tag != '\x01') {
      puStack_60 = &LAB_001170a6;
      __assert_fail("utf8Entry.tag == CONSTANT_Utf8",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                    ,0x1a4,"void ExecutionEngine::i_ldc_w()");
    }
    uVar2 = pcVar4[uVar15 - 1].info.fieldref_info.class_index;
    uVar14 = (ulong)uVar2;
    lVar6 = -(ulong)(uVar2 + 0x10 & 0xfffffff0);
    __s = (char *)((long)&local_58 + lVar6);
    if (uVar2 == 0) {
      uVar14 = 0;
    }
    else {
      puVar10 = pcVar4[uVar15 - 1].info.utf8_info.bytes;
      uVar15 = 0;
      do {
        __s[uVar15] = puVar10[uVar15];
        uVar15 = uVar15 + 1;
      } while (uVar14 != uVar15);
    }
    __s[uVar14] = '\0';
    *(undefined8 *)((long)&puStack_60 + lVar6) = 0x116fdc;
    this_02 = (StringObject *)operator_new(0x28);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    *(undefined8 *)((long)&puStack_60 + lVar6) = 0x116fef;
    sVar12 = strlen(__s);
    *(undefined8 *)((long)&puStack_60 + lVar6) = 0x116fff;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,__s,__s + sVar12);
    *(undefined8 *)((long)&puStack_60 + lVar6) = 0x11700b;
    StringObject::StringObject(this_02,&local_58);
    _Var8._M_p = local_58._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      *(undefined8 *)((long)&puStack_60 + lVar6) = 0x117023;
      operator_delete(_Var8._M_p);
    }
    uVar15 = (ulong)this_02 & 0xffffffff00000000;
    uVar16 = 0x900000000;
  }
  operand.data.longValue = (ulong)this_02 & 0xffffffff | uVar15;
  puStack_60 = (undefined1 *)0x117044;
  operand.printType = (int)uVar16;
  operand.type = (int)((ulong)uVar16 >> 0x20);
  Frame::pushIntoOperandStack(this_01,operand);
  this_01->pc = this_01->pc + 3;
  return;
}

Assistant:

void ExecutionEngine::i_ldc_w() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();
    
    u1 *code = topFrame->getCode(topFrame->pc);
    u1 byte1 = code[1];
    u1 byte2 = code[2];
    u2 index = (byte1 << 8) | byte2;
    
    cp_info *constantPool = *(topFrame->getConstantPool());
    cp_info entry = constantPool[index-1];
    
    Value value;
    
    if (entry.tag == CONSTANT_String) {
        cp_info utf8Entry = constantPool[entry.info.string_info.string_index-1];
        assert(utf8Entry.tag == CONSTANT_Utf8);
        
        u1* bytes = utf8Entry.info.utf8_info.bytes;
        char utf8String[utf8Entry.info.utf8_info.length+1];
        int i;
        for (i = 0; i < utf8Entry.info.utf8_info.length; i++) {
            utf8String[i] = bytes[i];
        }
        utf8String[i] = '\0';
        
        value.type = ValueType::REFERENCE;
        value.data.object = new StringObject(utf8String);
    } else if (entry.tag == CONSTANT_Integer) {
        value.printType = ValueType::INT;
        value.type = ValueType::INT;
        value.data.intValue = entry.info.integer_info.bytes;
    } else if (entry.tag == CONSTANT_Float) {
        u4 floatBytes = entry.info.float_info.bytes;
        int s = ((floatBytes >> 31) == 0) ? 1 : -1;
        int e = ((floatBytes >> 23) & 0xff);
        int m = (e == 0) ? (floatBytes & 0x7fffff) << 1 : (floatBytes & 0x7fffff) | 0x800000;
        
        float number = s*m*pow(2, e-150);
        value.type = ValueType::FLOAT;
        value.data.floatValue = number;
    } else {
        cerr << "ldc_w tentando acessar um elemento da CP invalido: " << entry.tag << endl;
        exit(1);
    }
    
    topFrame->pushIntoOperandStack(value);
    topFrame->pc += 3;
}